

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O2

void ourWriteOut(CURL *curl,per_transfer *per,char *writeinfo)

{
  char cVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  FILE *__stream;
  double doubleinfo;
  long longinfo;
  char *stringp;
  
  stringp = (char *)0x0;
  __stream = _stdout;
LAB_0011c42e:
  writeinfo = writeinfo + 1;
  do {
    pcVar9 = writeinfo + -1;
    if (pcVar9 == (char *)0x0) {
      return;
    }
    cVar1 = *pcVar9;
    if (cVar1 != '%') {
      if (cVar1 == '\0') {
        return;
      }
      if (cVar1 != '\\') goto LAB_0011c4d3;
      cVar1 = *writeinfo;
      iVar4 = 0x5c;
      if (cVar1 != '\0') {
        if (cVar1 == 't') {
          iVar4 = 9;
        }
        else {
          iVar4 = 0xd;
          if (cVar1 != 'r') {
            if (cVar1 != 'n') {
              iVar4 = 0x5c;
              goto LAB_0011c4c1;
            }
            iVar4 = 10;
          }
        }
        goto LAB_0011c597;
      }
LAB_0011c4d6:
      fputc(iVar4,__stream);
      goto LAB_0011c42e;
    }
    cVar2 = *writeinfo;
    if (cVar2 != '{') {
      if (cVar2 == '\0') {
LAB_0011c4d3:
        iVar4 = (int)cVar1;
        goto LAB_0011c4d6;
      }
      iVar4 = 0x25;
      if (cVar2 != '%') {
LAB_0011c4c1:
        fputc(iVar4,__stream);
        iVar4 = (int)*writeinfo;
      }
LAB_0011c597:
      fputc(iVar4,__stream);
      writeinfo = writeinfo + 1;
      goto LAB_0011c42e;
    }
    pcVar9 = strchr(pcVar9,0x7d);
    if (pcVar9 != (char *)0x0) break;
    fputs("%{",__stream);
    writeinfo = writeinfo + 2;
  } while( true );
  cVar1 = *pcVar9;
  *pcVar9 = '\0';
  lVar3 = 0;
  do {
    lVar6 = lVar3;
    if (lVar6 + 0x18 == 0x378) {
      curl_mfprintf(_stderr,"curl: unknown --write-out variable: \'%s\'\n",writeinfo + 1);
      goto switchD_0011c547_default;
    }
    iVar4 = curl_strequal(writeinfo + 1,*(undefined8 *)((long)&variables[0].name + lVar6));
    lVar3 = lVar6 + 0x18;
  } while (iVar4 == 0);
  switch(*(undefined4 *)((long)&variables[0].id + lVar6)) {
  case 1:
    uVar7 = 0x300003;
    goto LAB_0011c8ed;
  case 2:
    uVar7 = 0x300004;
    goto LAB_0011c8ed;
  case 3:
    uVar7 = 0x300005;
    goto LAB_0011c8ed;
  case 4:
    uVar7 = 0x300021;
    goto LAB_0011c8ed;
  case 5:
    uVar7 = 0x300006;
    goto LAB_0011c8ed;
  case 6:
    uVar7 = 0x300011;
    goto LAB_0011c8ed;
  case 7:
    uVar7 = 0x300008;
    goto LAB_0011c7be;
  case 8:
    uVar7 = 0x300007;
LAB_0011c7be:
    iVar4 = curl_easy_getinfo(curl,uVar7,&doubleinfo);
    if (iVar4 != 0) goto switchD_0011c547_default;
    pcVar8 = "%.0f";
    goto LAB_0011c909;
  case 9:
    uVar7 = 0x300009;
    goto LAB_0011c83a;
  case 10:
    uVar7 = 0x30000a;
LAB_0011c83a:
    iVar4 = curl_easy_getinfo(curl,uVar7,&doubleinfo);
    if (iVar4 != 0) goto switchD_0011c547_default;
    pcVar8 = "%.3f";
    goto LAB_0011c909;
  case 0xb:
    uVar7 = 0x200002;
    goto LAB_0011c808;
  case 0xc:
    uVar7 = 0x200016;
LAB_0011c808:
    iVar4 = curl_easy_getinfo(curl,uVar7,&longinfo);
    if (iVar4 != 0) goto switchD_0011c547_default;
    pcVar8 = "%03ld";
    goto LAB_0011c96d;
  case 0xd:
    uVar7 = 0x20000b;
    break;
  case 0xe:
    curl_mfprintf(__stream,"%ld",per->num_headers);
    goto switchD_0011c547_default;
  case 0xf:
    uVar7 = 0x20000c;
    break;
  case 0x10:
    uVar7 = 0x10003a;
    goto LAB_0011c98e;
  case 0x11:
    uVar7 = 0x100001;
    goto LAB_0011c98e;
  case 0x12:
    uVar7 = 0x100012;
    goto LAB_0011c98e;
  case 0x13:
    uVar7 = 0x20001a;
    break;
  case 0x14:
    uVar7 = 0x300013;
LAB_0011c8ed:
    iVar4 = curl_easy_getinfo(curl,uVar7,&doubleinfo);
    if (iVar4 == 0) {
      pcVar8 = "%.6f";
LAB_0011c909:
      curl_mfprintf(doubleinfo,__stream,pcVar8);
    }
    goto switchD_0011c547_default;
  case 0x15:
    uVar7 = 0x200014;
    break;
  case 0x16:
    uVar7 = 0x10001e;
    goto LAB_0011c98e;
  case 0x17:
    uVar7 = 0x10001f;
    goto LAB_0011c98e;
  case 0x18:
    uVar7 = 0x20000d;
    break;
  case 0x19:
    uVar7 = 0x20002f;
    break;
  case 0x1a:
    pcVar8 = (per->outs).filename;
    if (pcVar8 == (char *)0x0) goto switchD_0011c547_default;
    goto LAB_0011c9b2;
  case 0x1b:
    uVar7 = 0x100020;
    goto LAB_0011c98e;
  case 0x1c:
    uVar7 = 0x200028;
    break;
  case 0x1d:
    uVar7 = 0x100029;
    goto LAB_0011c98e;
  case 0x1e:
    uVar7 = 0x20002a;
    break;
  case 0x1f:
    iVar4 = curl_easy_getinfo(curl,0x20002e,&longinfo);
    if (iVar4 == 0) {
      if (longinfo == 0x1e) {
        pcVar8 = "3";
      }
      else if (longinfo == 2) {
        pcVar8 = "1.1";
      }
      else if (longinfo == 3) {
        pcVar8 = "2";
      }
      else if (longinfo == 1) {
        pcVar8 = "1.0";
      }
      else {
        pcVar8 = "0";
      }
      curl_mfprintf(__stream,pcVar8);
    }
    goto switchD_0011c547_default;
  case 0x20:
    uVar7 = 0x100031;
LAB_0011c98e:
    iVar4 = curl_easy_getinfo(curl,uVar7,&stringp);
    pcVar8 = stringp;
    if (stringp != (char *)0x0 && iVar4 == 0) {
LAB_0011c9b2:
      fputs(pcVar8,__stream);
    }
    goto switchD_0011c547_default;
  case 0x21:
    puVar5 = (undefined8 *)&stdout;
    goto LAB_0011c8bc;
  case 0x22:
    puVar5 = (undefined8 *)&stderr;
LAB_0011c8bc:
    __stream = (FILE *)*puVar5;
    goto switchD_0011c547_default;
  case 0x23:
    ourWriteOutJSON(variables,curl,per,(FILE *)__stream);
  default:
    goto switchD_0011c547_default;
  }
  iVar4 = curl_easy_getinfo(curl,uVar7,&longinfo);
  if (iVar4 == 0) {
    pcVar8 = "%ld";
LAB_0011c96d:
    curl_mfprintf(__stream,pcVar8,longinfo);
  }
switchD_0011c547_default:
  writeinfo = pcVar9 + 1;
  *pcVar9 = cVar1;
  goto LAB_0011c42e;
}

Assistant:

void ourWriteOut(CURL *curl, struct per_transfer *per, const char *writeinfo)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  char *stringp = NULL;
  long longinfo;
  double doubleinfo;

  while(ptr && *ptr) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        if('{' == ptr[1]) {
          char keepit;
          int i;
          bool match = FALSE;
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          keepit = *end;
          *end = 0; /* null-terminate */
          for(i = 0; variables[i].name; i++) {
            if(curl_strequal(ptr, variables[i].name)) {
              match = TRUE;
              switch(variables[i].id) {
              case VAR_EFFECTIVE_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_EFFECTIVE_METHOD:
                if((CURLE_OK == curl_easy_getinfo(curl,
                                                  CURLINFO_EFFECTIVE_METHOD,
                                                  &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_HTTP_CODE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_NUM_HEADERS:
                fprintf(stream, "%ld", per->num_headers);
                break;
              case VAR_HTTP_CODE_PROXY:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_CONNECTCODE,
                                     &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HEADER_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HEADER_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REQUEST_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REQUEST_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_NUM_CONNECTS:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NUM_CONNECTS, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_COUNT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_COUNT, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_TOTAL_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_TOTAL_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_NAMELOOKUP_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NAMELOOKUP_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_CONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_CONNECT_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_APPCONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_APPCONNECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_PRETRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRETRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_STARTTRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_STARTTRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_SIZE_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SIZE_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SPEED_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_SPEED_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_CONTENT_TYPE:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_CONTENT_TYPE, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_FTP_ENTRY_PATH:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_FTP_ENTRY_PATH, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_REDIRECT_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_REDIRECT_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_PROXY_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PROXY_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_EFFECTIVE_FILENAME:
                if(per->outs.filename)
                  fputs(per->outs.filename, stream);
                break;
              case VAR_PRIMARY_IP:
                if((CURLE_OK == curl_easy_getinfo(curl, CURLINFO_PRIMARY_IP,
                                                  &stringp)) && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_PRIMARY_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRIMARY_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_LOCAL_IP:
                if((CURLE_OK == curl_easy_getinfo(curl, CURLINFO_LOCAL_IP,
                                                  &stringp)) && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_LOCAL_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_LOCAL_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_HTTP_VERSION:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_VERSION,
                                     &longinfo)) {
                  const char *version = "0";
                  switch(longinfo) {
                  case CURL_HTTP_VERSION_1_0:
                    version = "1.0";
                    break;
                  case CURL_HTTP_VERSION_1_1:
                    version = "1.1";
                    break;
                  case CURL_HTTP_VERSION_2_0:
                    version = "2";
                    break;
                  case CURL_HTTP_VERSION_3:
                    version = "3";
                    break;
                  }

                  fprintf(stream, version);
                }
                break;
              case VAR_SCHEME:
                if((CURLE_OK == curl_easy_getinfo(curl, CURLINFO_SCHEME,
                                                  &stringp)) && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_STDOUT:
                stream = stdout;
                break;
              case VAR_STDERR:
                stream = stderr;
                break;
              case VAR_JSON:
                ourWriteOutJSON(variables, curl, per, stream);
              default:
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }

}